

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_3_3::RgbaYca::reconstructChromaHoriz(int n,Rgba *ycaIn,Rgba *ycaOut)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  float fVar1;
  int j;
  int i;
  int end;
  int begin;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  undefined4 local_28;
  undefined4 local_24;
  
  local_28 = 0;
  for (local_24 = 0xd; local_24 < in_EDI + 0xd; local_24 = local_24 + 1) {
    if ((local_28 & 1) == 0) {
      *(undefined2 *)(in_RDX + (long)(int)local_28 * 8) =
           *(undefined2 *)(in_RSI + (long)local_24 * 8);
      *(undefined2 *)(in_RDX + 4 + (long)(int)local_28 * 8) =
           *(undefined2 *)(in_RSI + 4 + (long)local_24 * 8);
    }
    else {
      in_stack_ffffffffffffff70 =
           Imath_3_1::half::operator_cast_to_float
                     ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      fVar1 = Imath_3_1::half::operator_cast_to_float
                        ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      in_stack_ffffffffffffff74 = in_stack_ffffffffffffff70 * 0.002128 + fVar1 * -0.00754;
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator_cast_to_float
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      Imath_3_1::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c);
    }
    *(undefined2 *)(in_RDX + 2 + (long)(int)local_28 * 8) =
         *(undefined2 *)(in_RSI + 2 + (long)local_24 * 8);
    *(undefined2 *)(in_RDX + 6 + (long)(int)local_28 * 8) =
         *(undefined2 *)(in_RSI + 6 + (long)local_24 * 8);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void
reconstructChromaHoriz (int n, const Rgba ycaIn[/*n+N-1*/], Rgba ycaOut[/*n*/])
{
#ifdef DEBUG
    assert (ycaIn != ycaOut);
#endif

    int begin = N2;
    int end   = begin + n;

    for (int i = begin, j = 0; i < end; ++i, ++j)
    {
        if (j & 1)
        {
            ycaOut[j].r =
                ycaIn[i - 13].r * 0.002128f + ycaIn[i - 11].r * -0.007540f +
                ycaIn[i - 9].r * 0.019597f + ycaIn[i - 7].r * -0.043159f +
                ycaIn[i - 5].r * 0.087929f + ycaIn[i - 3].r * -0.186077f +
                ycaIn[i - 1].r * 0.627123f + ycaIn[i + 1].r * 0.627123f +
                ycaIn[i + 3].r * -0.186077f + ycaIn[i + 5].r * 0.087929f +
                ycaIn[i + 7].r * -0.043159f + ycaIn[i + 9].r * 0.019597f +
                ycaIn[i + 11].r * -0.007540f + ycaIn[i + 13].r * 0.002128f;

            ycaOut[j].b =
                ycaIn[i - 13].b * 0.002128f + ycaIn[i - 11].b * -0.007540f +
                ycaIn[i - 9].b * 0.019597f + ycaIn[i - 7].b * -0.043159f +
                ycaIn[i - 5].b * 0.087929f + ycaIn[i - 3].b * -0.186077f +
                ycaIn[i - 1].b * 0.627123f + ycaIn[i + 1].b * 0.627123f +
                ycaIn[i + 3].b * -0.186077f + ycaIn[i + 5].b * 0.087929f +
                ycaIn[i + 7].b * -0.043159f + ycaIn[i + 9].b * 0.019597f +
                ycaIn[i + 11].b * -0.007540f + ycaIn[i + 13].b * 0.002128f;
        }
        else
        {
            ycaOut[j].r = ycaIn[i].r;
            ycaOut[j].b = ycaIn[i].b;
        }

        ycaOut[j].g = ycaIn[i].g;
        ycaOut[j].a = ycaIn[i].a;
    }
}